

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall
helics::CommonCore::localError
          (CommonCore *this,LocalFederateId federateID,int errorCode,string_view errorString)

{
  FederateStates FVar1;
  MessageProcessingResult MVar2;
  FederateState *this_00;
  InvalidIdentifier *this_01;
  size_t size;
  string_view message;
  ActionMessage error;
  ActionMessage AStack_e8;
  
  size = errorString._M_len;
  this_00 = getFederateAt(this,federateID);
  if (this_00 == (FederateState *)0x0) {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    message._M_str = "federateID not valid error";
    message._M_len = 0x1a;
    InvalidIdentifier::InvalidIdentifier(this_01,message);
    __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  ActionMessage::ActionMessage(&AStack_e8,cmd_local_error);
  AStack_e8.source_id.gid = (this_00->global_id)._M_i.gid;
  AStack_e8.messageID = errorCode;
  AStack_e8.payload.bufferSize = size;
  if ((AStack_e8.payload.heap != (byte *)errorString._M_str) &&
     (SmallBuffer::reserve(&AStack_e8.payload,size), size != 0)) {
    memcpy(AStack_e8.payload.heap,errorString._M_str,size);
  }
  if (this_00->mCallbackBased == true) {
    AStack_e8.flags._0_1_ = (byte)AStack_e8.flags | 0x20;
  }
  BrokerBase::addActionMessage(&this->super_BrokerBase,&AStack_e8);
  if (this_00->mCallbackBased == false) {
    FederateState::addAction(this_00,&AStack_e8);
    MVar2 = NEXT_STEP;
    do {
      if (((MVar2 == ERROR_RESULT) || (FVar1 = FederateState::getState(this_00), FVar1 == FINISHED))
         || (FVar1 = FederateState::getState(this_00), FVar1 == ERRORED)) break;
      MVar2 = FederateState::genericUnspecifiedQueueProcess(this_00,false);
    } while ((10 < (byte)MVar2) || ((0x488U >> ((byte)MVar2 & 0x1f) & 1) == 0));
  }
  ActionMessage::~ActionMessage(&AStack_e8);
  return;
}

Assistant:

void CommonCore::localError(LocalFederateId federateID, int errorCode, std::string_view errorString)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid error"));
    }
    ActionMessage error(CMD_LOCAL_ERROR);
    error.source_id = fed->global_id.load();
    error.messageID = errorCode;
    error.payload = errorString;
    if (fed->isCallbackFederate()) {
        setActionFlag(error, indicator_flag);
    }
    addActionMessage(error);
    if (fed->isCallbackFederate()) {
        return;
    }
    fed->addAction(error);
    MessageProcessingResult ret = MessageProcessingResult::NEXT_STEP;
    while (ret != MessageProcessingResult::ERROR_RESULT) {
        if (fed->getState() == FederateStates::FINISHED ||
            fed->getState() == FederateStates::ERRORED) {
            return;
        }
        ret = fed->genericUnspecifiedQueueProcess(false);
        switch (ret) {
            case MessageProcessingResult::ERROR_RESULT:
            case MessageProcessingResult::HALTED:
            case MessageProcessingResult::BUSY:
                return;
            default:
                break;
        }
    }
}